

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter3.cpp
# Opt level: O1

shared_ptr<ApplicationContextBase>
CreateApplicationContext(GraphicsContext *gc,shared_ptr<UIContext> *ui)

{
  shared_ptr<UIContext> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<ApplicationContextBase> sVar1;
  undefined1 local_29;
  ApplicationContext *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  local_28 = (ApplicationContext *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ApplicationContext,std::allocator<ApplicationContext>,GraphicsContext&,std::shared_ptr<UIContext>&>
            (&_Stack_20,&local_28,(allocator<ApplicationContext> *)&local_29,(GraphicsContext *)ui,
             in_RDX);
  std::__shared_ptr<ApplicationContext,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<ApplicationContext,ApplicationContext>
            ((__shared_ptr<ApplicationContext,(__gnu_cxx::_Lock_policy)2> *)&local_28,local_28);
  gc[1]._vptr_GraphicsContext = (_func_int **)0x0;
  gc->_vptr_GraphicsContext = (_func_int **)local_28;
  gc[1]._vptr_GraphicsContext = (_func_int **)_Stack_20._M_pi;
  sVar1.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)gc;
  return (shared_ptr<ApplicationContextBase>)
         sVar1.super___shared_ptr<ApplicationContextBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ApplicationContextBase> CreateApplicationContext(GraphicsContext& gc, std::shared_ptr<UIContext> ui)
{
    return std::make_shared<ApplicationContext>(gc, ui);
}